

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O1

UChar * u_uastrcpy_63(UChar *ucs1,char *s2)

{
  uint in_EAX;
  UConverter *cnv;
  size_t sVar1;
  UErrorCode err;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  cnv = u_getDefaultConverter_63((UErrorCode *)((long)&uStack_28 + 4));
  if (cnv != (UConverter *)0x0 && uStack_28._4_4_ < 1) {
    sVar1 = strlen(s2);
    ucnv_toUChars_63(cnv,ucs1,0xfffffff,s2,(int32_t)sVar1,(UErrorCode *)((long)&uStack_28 + 4));
    u_releaseDefaultConverter_63(cnv);
    if (uStack_28._4_4_ < 1) {
      return ucs1;
    }
  }
  *ucs1 = L'\0';
  return ucs1;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_uastrcpy(UChar *ucs1,
          const char *s2 )
{
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    ucnv_toUChars(cnv,
                    ucs1,
                    MAX_STRLEN,
                    s2,
                    (int32_t)uprv_strlen(s2),
                    &err);
    u_releaseDefaultConverter(cnv);
    if(U_FAILURE(err)) {
      *ucs1 = 0;
    }
  } else {
    *ucs1 = 0;
  }
  return ucs1;
}